

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportTryCompileFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportTryCompileFileGenerator::cmExportTryCompileFileGenerator
          (cmExportTryCompileFileGenerator *this,cmGlobalGenerator *gg,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *targets,cmMakefile *mf,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *langs)

{
  allocator_type local_39;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  local_38 = targets;
  cmExportFileGenerator::cmExportFileGenerator(&this->super_cmExportFileGenerator);
  (this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator =
       (_func_int **)&PTR__cmExportTryCompileFileGenerator_005d3a48;
  (this->Exports).
  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Exports).
  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Exports).
  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Config)._M_dataplus._M_p = (pointer)&(this->Config).field_2;
  (this->Config)._M_string_length = 0;
  (this->Config).field_2._M_local_buf[0] = '\0';
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<std::_Rb_tree_const_iterator<std::__cxx11::string>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->Languages,
             (langs->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )&(langs->_M_t)._M_impl.super__Rb_tree_header,&local_39);
  cmGlobalGenerator::CreateImportedGenerationObjects(gg,mf,local_38,&this->Exports);
  return;
}

Assistant:

cmExportTryCompileFileGenerator::cmExportTryCompileFileGenerator(
  cmGlobalGenerator* gg, const std::vector<std::string>& targets,
  cmMakefile* mf, std::set<std::string> const& langs)
  : Languages(langs.begin(), langs.end())
{
  gg->CreateImportedGenerationObjects(mf, targets, this->Exports);
}